

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  bool bVar1;
  Result result;
  RegisterCommand *this_00;
  string_view local_140;
  Enum local_12c;
  Var local_128;
  undefined4 local_e0;
  Enum local_dc;
  Location local_d8;
  undefined1 local_b8 [8];
  Var var;
  string text;
  undefined1 local_48 [8];
  Location loc;
  CommandPtr *out_command_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    result = Expect(this,Register);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)(var.field_2.field2 + 0x18));
      Location::Location(&local_d8);
      Var::Var((Var *)local_b8,0xffffffff,&local_d8);
      local_dc = (Enum)ParseQuotedText(this,(string *)((long)&var.field_2 + 0x18));
      bVar1 = Failed((Result)local_dc);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Var::Var(&local_128,this->last_module_index_,(Location *)local_48);
        ParseVarOpt(this,(Var *)local_b8,&local_128);
        Var::~Var(&local_128);
        local_12c = (Enum)Expect(this,Rpar);
        bVar1 = Failed((Result)local_12c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          this_00 = (RegisterCommand *)operator_new(0x78);
          string_view::string_view(&local_140,(string *)((long)&var.field_2 + 0x18));
          RegisterCommand::RegisterCommand(this_00,local_140,(Var *)local_b8);
          std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::reset
                    (out_command,(pointer)this_00);
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
      }
      local_e0 = 1;
      Var::~Var((Var *)local_b8);
      std::__cxx11::string::~string((string *)(var.field_2.field2 + 0x18));
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}